

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O2

void __thiscall manager::Manager<uttt::IBoard>::RoundRobin(Manager<uttt::IBoard> *this)

{
  __node_base *p_Var1;
  __node_base *p_Var2;
  
  p_Var1 = &(this->bots)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var2 = p_Var1, p_Var1 != (__node_base *)0x0) {
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      Match(this,(longlong)
                 (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)
                 ->_M_nxt,
            (longlong)
            (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)->
            _M_nxt,2);
    }
  }
  return;
}

Assistant:

void
Manager<IGame>::RoundRobin()
{
    for (auto it1 = bots.begin(); it1 != bots.end(); ++it1)
    {
        auto it2 = it1;
        ++it2;
        for (; it2 != bots.end(); ++it2)
            Match(it1->second->id, it2->second->id, 2);
    }
}